

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser * init_parse_slay(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"code str code",parse_slay_code);
  parser_reg(p,"name str name",parse_slay_name);
  parser_reg(p,"race-flag sym flag",parse_slay_race_flag);
  parser_reg(p,"base sym base",parse_slay_base);
  parser_reg(p,"multiplier uint multiplier",parse_slay_multiplier);
  parser_reg(p,"o-multiplier uint multiplier",parse_slay_o_multiplier);
  parser_reg(p,"power uint power",parse_slay_power);
  parser_reg(p,"melee-verb str verb",parse_slay_melee_verb);
  parser_reg(p,"range-verb str verb",parse_slay_range_verb);
  return p;
}

Assistant:

static struct parser *init_parse_slay(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "code str code", parse_slay_code);
	parser_reg(p, "name str name", parse_slay_name);
	parser_reg(p, "race-flag sym flag", parse_slay_race_flag);
	parser_reg(p, "base sym base", parse_slay_base);
	parser_reg(p, "multiplier uint multiplier", parse_slay_multiplier);
	parser_reg(p, "o-multiplier uint multiplier", parse_slay_o_multiplier);
	parser_reg(p, "power uint power", parse_slay_power);
	parser_reg(p, "melee-verb str verb", parse_slay_melee_verb);
	parser_reg(p, "range-verb str verb", parse_slay_range_verb);
	return p;
}